

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Value * soul::AST::TypeMetaFunction::performOp(Value *__return_storage_ptr__,Op op,Type *sourceType)

{
  bool bVar1;
  BoundedIntSize BVar2;
  undefined8 local_38;
  Type *sourceType_local;
  Op op_local;
  
  if (op == size) {
    bVar1 = Type::isBoundedInt(sourceType);
    if (bVar1) {
      BVar2 = Type::getBoundedIntLimit(sourceType);
      local_38 = (ArraySize)BVar2;
    }
    else {
      local_38 = Type::getArrayOrVectorSize(sourceType);
    }
    soul::Value::createInt64<unsigned_long>(__return_storage_ptr__,local_38);
  }
  else {
    bVar1 = performBoolOp(op,sourceType);
    soul::Value::Value(__return_storage_ptr__,bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value performOp (Op op, const Type& sourceType)
        {
            if (op == Op::size)
                return Value::createInt64 (sourceType.isBoundedInt() ? (uint64_t) sourceType.getBoundedIntLimit()
                                                                     : (uint64_t) sourceType.getArrayOrVectorSize());

            return Value (performBoolOp (op, sourceType));
        }